

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerHLSL::emit_specialization_constants_and_structs(CompilerHLSL *this)

{
  ParsedIR *this_00;
  Variant *this_01;
  uint id;
  int iVar1;
  TypedID<(spirv_cross::Types)0> *pTVar2;
  size_t sVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  uint32_t id_00;
  uint32_t id_01;
  SPIRVariable *var;
  SPIRType *pSVar7;
  ulong uVar8;
  SPIRConstant *pSVar9;
  SPIRUndef *pSVar10;
  SPIRConstantOp *pSVar11;
  size_type sVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1;
  long lVar13;
  string *ts_1_00;
  string name;
  string local_d0;
  LoopLock loop_lock;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  TypedID<(spirv_cross::Types)0> *local_88;
  SpecializationConstant wg_z;
  SpecializationConstant wg_y;
  SpecializationConstant wg_x;
  unordered_set<spirv_cross::TypedID<(spirv_cross::Types)1>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)1>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)1>_>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)1>_>_>
  io_block_types;
  
  wg_x.id.id = 0;
  wg_y.id.id = 0;
  wg_z.id.id = 0;
  id_00 = Compiler::get_work_group_size_specialization_constants((Compiler *)this,&wg_x,&wg_y,&wg_z)
  ;
  io_block_types._M_h._M_buckets = &io_block_types._M_h._M_single_bucket;
  io_block_types._M_h._M_bucket_count = 1;
  io_block_types._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  io_block_types._M_h._M_element_count = 0;
  io_block_types._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  io_block_types._M_h._M_rehash_policy._M_next_resize = 0;
  io_block_types._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this_00 = &(this->super_CompilerGLSL).super_Compiler.ir;
  ParsedIR::create_loop_hard_lock(this_00);
  pTVar2 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
  sVar3 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  for (lVar13 = 0; sVar3 << 2 != lVar13; lVar13 = lVar13 + 4) {
    id = *(uint *)((long)&pTVar2->id + lVar13);
    if ((this->super_CompilerGLSL).super_Compiler.ir.ids.super_VectorView<spirv_cross::Variant>.ptr
        [id].type == TypeVariable) {
      var = ParsedIR::get<spirv_cross::SPIRVariable>(this_00,id);
      pSVar7 = Compiler::get<spirv_cross::SPIRType>
                         ((Compiler *)this,*(uint32_t *)&(var->super_IVariant).field_0xc);
      if ((((((var->storage | StorageClassUniform) == Output) && (var->remapped_variable == false))
           && (pSVar7->pointer == true)) &&
          ((bVar4 = Compiler::is_builtin_variable((Compiler *)this,var), !bVar4 &&
           (bVar4 = Compiler::interface_variable_exists_in_entry_point
                              ((Compiler *)this,(var->super_IVariant).self.id), bVar4)))) &&
         (bVar4 = Compiler::has_decoration
                            ((Compiler *)this,(ID)(pSVar7->super_IVariant).self.id,Block), bVar4)) {
        local_d0._M_dataplus._M_p._0_4_ = (pSVar7->super_IVariant).self.id;
        ::std::__detail::
        _Insert<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)1>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)1>_>,_std::__detail::_Identity,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)1>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)1>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
        ::insert((_Insert<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)1>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)1>_>,_std::__detail::_Identity,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)1>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)1>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
                  *)&io_block_types,(value_type *)&local_d0);
      }
    }
  }
  ParsedIR::LoopLock::~LoopLock((LoopLock *)&name);
  ParsedIR::create_loop_hard_lock(this_00);
  local_88 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_constant_undef_or_type.
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
  sVar3 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_constant_undef_or_type.
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  bVar4 = false;
  for (lVar13 = 0; sVar3 << 2 != lVar13; lVar13 = lVar13 + 4) {
    uVar8 = (ulong)*(uint *)((long)&local_88->id + lVar13);
    ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (this->super_CompilerGLSL).super_Compiler.ir.ids.super_VectorView<spirv_cross::Variant>.
           ptr;
    this_01 = (Variant *)(&ts_1->_M_dataplus + uVar8 * 3);
    iVar1 = *(int *)((long)&ts_1->field_2 + uVar8 * 0x18);
    if (iVar1 == 1) {
      pSVar7 = Variant::get<spirv_cross::SPIRType>(this_01);
      bVar5 = Compiler::has_decoration((Compiler *)this,(ID)(pSVar7->super_IVariant).self.id,Block);
      if (bVar5) {
        name._M_dataplus._M_p._0_4_ = (pSVar7->super_IVariant).self.id;
        sVar12 = ::std::
                 _Hashtable<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)1>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)1>_>,_std::__detail::_Identity,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)1>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)1>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 ::count(&io_block_types._M_h,(key_type *)&name);
        bVar5 = sVar12 == 0;
      }
      else {
        bVar5 = false;
      }
      bVar6 = Compiler::has_decoration
                        ((Compiler *)this,(ID)(pSVar7->super_IVariant).self.id,BufferBlock);
      if (((pSVar7->basetype == Struct) &&
          ((pSVar7->array).super_VectorView<unsigned_int>.buffer_size == 0)) &&
         (!bVar6 && (!bVar5 && pSVar7->pointer == false))) {
        if (bVar4) {
          CompilerGLSL::statement<char_const(&)[1]>
                    (&this->super_CompilerGLSL,(char (*) [1])0x2fba29);
        }
        CompilerGLSL::emit_struct(&this->super_CompilerGLSL,pSVar7);
        bVar4 = false;
      }
      goto LAB_001ae957;
    }
    if (iVar1 == 0xc) {
      pSVar10 = Variant::get<spirv_cross::SPIRUndef>(this_01);
      pSVar7 = Compiler::get<spirv_cross::SPIRType>
                         ((Compiler *)this,*(uint32_t *)&(pSVar10->super_IVariant).field_0xc);
      if (pSVar7->basetype == Void) goto LAB_001aebb3;
      name._M_dataplus._M_p = (pointer)&name.field_2;
      name._M_string_length = 0;
      name.field_2._M_local_buf[0] = '\0';
      if (((this->super_CompilerGLSL).options.force_zero_initialized_variables == true) &&
         (bVar4 = CompilerGLSL::type_can_zero_initialize(&this->super_CompilerGLSL,pSVar7), bVar4))
      {
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x3b])
                  (&local_a8,this,(ulong)*(uint *)&(pSVar10->super_IVariant).field_0xc);
        join<char_const(&)[4],std::__cxx11::string>
                  (&local_d0,(spirv_cross *)0x34513c,(char (*) [4])&local_a8,ts_1);
        ::std::__cxx11::string::operator=((string *)&name,(string *)&local_d0);
        ::std::__cxx11::string::~string((string *)&local_d0);
        ::std::__cxx11::string::~string((string *)&local_a8);
      }
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                (&local_a8,this,(ulong)(pSVar10->super_IVariant).self.id,1);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1b])
                (&local_d0,this,pSVar7,&local_a8,(ulong)(pSVar10->super_IVariant).self.id);
      CompilerGLSL::
      statement<char_const(&)[8],std::__cxx11::string,std::__cxx11::string&,char_const(&)[2]>
                (&this->super_CompilerGLSL,(char (*) [8])"static ",&local_d0,&name,
                 (char (*) [2])0x344fd0);
      ::std::__cxx11::string::~string((string *)&local_d0);
      ::std::__cxx11::string::~string((string *)&local_a8);
LAB_001ae94f:
      ::std::__cxx11::string::~string((string *)&name);
      bVar4 = true;
    }
    else {
      if (iVar1 == 9) {
        pSVar11 = Variant::get<spirv_cross::SPIRConstantOp>(this_01);
        pSVar7 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,(pSVar11->basetype).id);
        CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,(pSVar11->super_IVariant).self.id)
        ;
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                  (&name,this,(ulong)(pSVar11->super_IVariant).self.id,1);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1b])
                  (&local_d0,this,pSVar7,&name,0);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x18])(&local_a8,this,pSVar11);
        CompilerGLSL::
        statement<char_const(&)[14],std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                  (&this->super_CompilerGLSL,(char (*) [14])"static const ",&local_d0,
                   (char (*) [4])0x34513c,&local_a8,(char (*) [2])0x344fd0);
        ::std::__cxx11::string::~string((string *)&local_a8);
LAB_001ae945:
        ::std::__cxx11::string::~string((string *)&local_d0);
        goto LAB_001ae94f;
      }
      if (iVar1 == 3) {
        pSVar9 = Variant::get<spirv_cross::SPIRConstant>(this_01);
        if ((pSVar9->super_IVariant).self.id == id_00) {
          pSVar9 = Compiler::get<spirv_cross::SPIRConstant>((Compiler *)this,id_00);
          CompilerGLSL::constant_expression_abi_cxx11_
                    (&name,&this->super_CompilerGLSL,pSVar9,false,false);
          CompilerGLSL::statement<char_const(&)[39],std::__cxx11::string,char_const(&)[2]>
                    (&this->super_CompilerGLSL,
                     (char (*) [39])"static const uint3 gl_WorkGroupSize = ",&name,
                     (char (*) [2])0x344fd0);
          goto LAB_001ae94f;
        }
        if (pSVar9->specialization == true) {
          pSVar7 = Compiler::get<spirv_cross::SPIRType>
                             ((Compiler *)this,*(uint32_t *)&(pSVar9->super_IVariant).field_0xc);
          CompilerGLSL::add_resource_name
                    (&this->super_CompilerGLSL,(pSVar9->super_IVariant).self.id);
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                    (&name,this,(ulong)(pSVar9->super_IVariant).self.id);
          bVar4 = Compiler::has_decoration
                            ((Compiler *)this,(ID)(pSVar9->super_IVariant).self.id,DecorationSpecId)
          ;
          if (bVar4) {
            id_01 = Compiler::get_decoration
                              ((Compiler *)this,(ID)(pSVar9->super_IVariant).self.id,
                               DecorationSpecId);
            CompilerGLSL::constant_value_macro_name_abi_cxx11_
                      (&local_d0,&this->super_CompilerGLSL,id_01);
            ts_1_00 = &pSVar9->specialization_constant_macro_name;
            ::std::__cxx11::string::operator=((string *)ts_1_00,(string *)&local_d0);
            ::std::__cxx11::string::~string((string *)&local_d0);
            CompilerGLSL::statement<char_const(&)[9],std::__cxx11::string&>
                      (&this->super_CompilerGLSL,(char (*) [9])"#ifndef ",ts_1_00);
            CompilerGLSL::constant_expression_abi_cxx11_
                      (&local_d0,&this->super_CompilerGLSL,pSVar9,false,false);
            CompilerGLSL::
            statement<char_const(&)[9],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string>
                      (&this->super_CompilerGLSL,(char (*) [9])"#define ",ts_1_00,
                       (char (*) [2])0x3175f1,&local_d0);
            ::std::__cxx11::string::~string((string *)&local_d0);
            CompilerGLSL::statement<char_const(&)[7]>
                      (&this->super_CompilerGLSL,(char (*) [7])0x2fbd0b);
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1b])
                      (&local_d0,this,pSVar7,&name,0);
            CompilerGLSL::
            statement<char_const(&)[14],std::__cxx11::string,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
                      (&this->super_CompilerGLSL,(char (*) [14])"static const ",&local_d0,
                       (char (*) [4])0x34513c,ts_1_00,(char (*) [2])0x344fd0);
          }
          else {
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1b])(&local_d0,this,pSVar7)
            ;
            CompilerGLSL::constant_expression_abi_cxx11_
                      (&local_a8,&this->super_CompilerGLSL,pSVar9,false,false);
            CompilerGLSL::
            statement<char_const(&)[14],std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                      (&this->super_CompilerGLSL,(char (*) [14])"static const ",&local_d0,
                       (char (*) [4])0x34513c,&local_a8,(char (*) [2])0x344fd0);
            ::std::__cxx11::string::~string((string *)&local_a8);
          }
          goto LAB_001ae945;
        }
      }
    }
LAB_001ae957:
  }
  if (bVar4) {
    CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x2fba29);
  }
LAB_001aebb3:
  ParsedIR::LoopLock::~LoopLock(&loop_lock);
  ::std::
  _Hashtable<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)1>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)1>_>,_std::__detail::_Identity,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)1>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)1>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&io_block_types._M_h);
  return;
}

Assistant:

void CompilerHLSL::emit_specialization_constants_and_structs()
{
	bool emitted = false;
	SpecializationConstant wg_x, wg_y, wg_z;
	ID workgroup_size_id = get_work_group_size_specialization_constants(wg_x, wg_y, wg_z);

	std::unordered_set<TypeID> io_block_types;
	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, const SPIRVariable &var) {
		auto &type = this->get<SPIRType>(var.basetype);
		if ((var.storage == StorageClassInput || var.storage == StorageClassOutput) &&
		    !var.remapped_variable && type.pointer && !is_builtin_variable(var) &&
		    interface_variable_exists_in_entry_point(var.self) &&
		    has_decoration(type.self, DecorationBlock))
		{
			io_block_types.insert(type.self);
		}
	});

	auto loop_lock = ir.create_loop_hard_lock();
	for (auto &id_ : ir.ids_for_constant_undef_or_type)
	{
		auto &id = ir.ids[id_];

		if (id.get_type() == TypeConstant)
		{
			auto &c = id.get<SPIRConstant>();

			if (c.self == workgroup_size_id)
			{
				statement("static const uint3 gl_WorkGroupSize = ",
				          constant_expression(get<SPIRConstant>(workgroup_size_id)), ";");
				emitted = true;
			}
			else if (c.specialization)
			{
				auto &type = get<SPIRType>(c.constant_type);
				add_resource_name(c.self);
				auto name = to_name(c.self);

				if (has_decoration(c.self, DecorationSpecId))
				{
					// HLSL does not support specialization constants, so fallback to macros.
					c.specialization_constant_macro_name =
							constant_value_macro_name(get_decoration(c.self, DecorationSpecId));

					statement("#ifndef ", c.specialization_constant_macro_name);
					statement("#define ", c.specialization_constant_macro_name, " ", constant_expression(c));
					statement("#endif");
					statement("static const ", variable_decl(type, name), " = ", c.specialization_constant_macro_name, ";");
				}
				else
					statement("static const ", variable_decl(type, name), " = ", constant_expression(c), ";");

				emitted = true;
			}
		}
		else if (id.get_type() == TypeConstantOp)
		{
			auto &c = id.get<SPIRConstantOp>();
			auto &type = get<SPIRType>(c.basetype);
			add_resource_name(c.self);
			auto name = to_name(c.self);
			statement("static const ", variable_decl(type, name), " = ", constant_op_expression(c), ";");
			emitted = true;
		}
		else if (id.get_type() == TypeType)
		{
			auto &type = id.get<SPIRType>();
			bool is_non_io_block = has_decoration(type.self, DecorationBlock) &&
			                       io_block_types.count(type.self) == 0;
			bool is_buffer_block = has_decoration(type.self, DecorationBufferBlock);
			if (type.basetype == SPIRType::Struct && type.array.empty() &&
			    !type.pointer && !is_non_io_block && !is_buffer_block)
			{
				if (emitted)
					statement("");
				emitted = false;

				emit_struct(type);
			}
		}
		else if (id.get_type() == TypeUndef)
		{
			auto &undef = id.get<SPIRUndef>();
			auto &type = this->get<SPIRType>(undef.basetype);
			// OpUndef can be void for some reason ...
			if (type.basetype == SPIRType::Void)
				return;

			string initializer;
			if (options.force_zero_initialized_variables && type_can_zero_initialize(type))
				initializer = join(" = ", to_zero_initialized_expression(undef.basetype));

			statement("static ", variable_decl(type, to_name(undef.self), undef.self), initializer, ";");
			emitted = true;
		}
	}

	if (emitted)
		statement("");
}